

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image
          (Fl_PostScript_Graphics_Driver *this,uchar *data,int ix,int iy,int iw,int ih,int D,int LD)

{
  uchar *local_38;
  callback_data cb_data;
  int ih_local;
  int iw_local;
  int iy_local;
  int ix_local;
  uchar *data_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  cb_data.D = ih;
  cb_data.LD = iw;
  if (D < 3) {
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x30])
              (this,data,(ulong)(uint)ix,(ulong)(uint)iy,(ulong)(uint)iw,(ulong)(uint)ih,D,LD);
  }
  else {
    if (LD == 0) {
      LD = iw * D;
    }
    cb_data.data._0_4_ = D;
    cb_data.data._4_4_ = LD;
    local_38 = data;
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x31])
              (this,draw_image_cb,&local_38,(ulong)(uint)ix,(ulong)(uint)iy,(ulong)(uint)iw,ih,D);
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image(const uchar *data, int ix, int iy, int iw, int ih, int D, int LD) {
  if (D<3){ //mono
    draw_image_mono(data, ix, iy, iw, ih, D, LD);
    return;
  }

  struct callback_data cb_data;

  if (!LD) LD = iw*D;

  cb_data.data = data;
  cb_data.D = D;
  cb_data.LD = LD;

  draw_image(draw_image_cb, &cb_data, ix, iy, iw, ih, D);
}